

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_u_tau(REF_DBL y,REF_DBL u,REF_DBL nu_mach_re,REF_DBL *u_tau)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_90;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_INT iters;
  REF_BOOL keep_going;
  REF_DBL du_tau;
  REF_DBL dyplus_du_tau;
  REF_DBL duplus_du_tau;
  REF_DBL uplus_error_du_tau;
  REF_DBL dyplus_duplus;
  REF_DBL uplus_error;
  REF_DBL yplus;
  REF_DBL uplus;
  REF_DBL *u_tau_local;
  REF_DBL nu_mach_re_local;
  REF_DBL u_local;
  REF_DBL y_local;
  
  local_90 = u;
  if (u <= 0.0) {
    local_90 = -u;
  }
  nu_mach_re_local = local_90;
  local_98 = y;
  if (y <= 0.0) {
    local_98 = -y;
  }
  u_local = local_98;
  if (local_98 * 1e+20 <= 0.0) {
    local_a0 = -(local_98 * 1e+20);
  }
  else {
    local_a0 = local_98 * 1e+20;
  }
  if (local_90 <= 0.0) {
    local_b0 = -local_90;
  }
  else {
    local_b0 = local_90;
  }
  if (local_b0 < local_a0) {
    uplus = (REF_DBL)u_tau;
    u_tau_local = (REF_DBL *)nu_mach_re;
    dVar5 = sqrt((local_90 / local_98) * nu_mach_re);
    *(double *)uplus = dVar5;
    if (*(double *)uplus <= nu_mach_re_local / 30.0) {
      local_b8 = nu_mach_re_local / 30.0;
    }
    else {
      local_b8 = *(double *)uplus;
    }
    *(double *)uplus = local_b8;
    ref_private_macro_code_rss = 0;
    bVar2 = true;
    do {
      if (!bVar2) {
        return 0;
      }
      yplus = nu_mach_re_local / *(double *)uplus;
      dVar4 = -nu_mach_re_local;
      dVar5 = *(double *)uplus;
      dVar1 = *(double *)uplus;
      uplus_error = (u_local * *(double *)uplus) / (double)u_tau_local;
      dVar6 = u_local / (double)u_tau_local;
      uVar3 = ref_phys_spalding_uplus(uplus_error,&dyplus_duplus);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x2da,"ref_phys_u_tau",(ulong)uVar3,"uplus");
        return uVar3;
      }
      dyplus_duplus = dyplus_duplus - yplus;
      uVar3 = ref_phys_spalding_dyplus_duplus(yplus,&uplus_error_du_tau);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x2dd,"ref_phys_u_tau",(ulong)uVar3,"dyplus_duplus");
        return uVar3;
      }
      *(double *)uplus =
           -dyplus_duplus / (dVar6 / uplus_error_du_tau - dVar4 / (dVar5 * dVar1)) +
           *(double *)uplus;
      if (yplus * 1e+20 <= 0.0) {
        local_c0 = -(yplus * 1e+20);
      }
      else {
        local_c0 = yplus * 1e+20;
      }
      if (dyplus_duplus <= 0.0) {
        local_d0 = -dyplus_duplus;
      }
      else {
        local_d0 = dyplus_duplus;
      }
      if (local_c0 <= local_d0) {
LAB_0022db4d:
        if (dyplus_duplus <= 0.0) {
          local_e8 = -dyplus_duplus;
        }
        else {
          local_e8 = dyplus_duplus;
        }
        bVar2 = 1e-15 < local_e8;
      }
      else {
        if (yplus <= 0.0) {
          local_d8 = -yplus;
        }
        else {
          local_d8 = yplus;
        }
        if (local_d8 <= 0.001) goto LAB_0022db4d;
        if (dyplus_duplus / yplus <= 0.0) {
          local_e0 = -(dyplus_duplus / yplus);
        }
        else {
          local_e0 = dyplus_duplus / yplus;
        }
        bVar2 = 1e-12 < local_e0;
      }
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
    } while (ref_private_macro_code_rss < 100);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2ef,
           "ref_phys_u_tau","iteration count exceeded");
    printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n",u_local,nu_mach_re_local,uplus_error,
           yplus,dyplus_duplus,*(undefined8 *)uplus);
    y_local._4_4_ = 1;
  }
  else {
    *u_tau = nu_mach_re;
    y_local._4_4_ = 0;
  }
  return y_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_u_tau(REF_DBL y, REF_DBL u, REF_DBL nu_mach_re,
                                  REF_DBL *u_tau) {
  REF_DBL uplus, yplus;
  REF_DBL uplus_error;
  REF_DBL dyplus_duplus;
  REF_DBL uplus_error_du_tau;
  REF_DBL duplus_du_tau, dyplus_du_tau;
  REF_DBL du_tau;
  REF_BOOL keep_going;
  REF_INT iters;
  REF_BOOL verbose = REF_FALSE;
  u = ABS(u); /* only admit positive values */
  y = ABS(y);
  if (!ref_math_divisible(u, y)) {
    *u_tau = nu_mach_re;
    if (verbose) {
      uplus = u / (*u_tau);
      yplus = y * (*u_tau) / nu_mach_re;
      uplus_error = 0.0;
      printf("u_tau %e yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    }
    return REF_SUCCESS;
  }
  *u_tau = sqrt(u / y * nu_mach_re); /* guess to start newton */
  uplus = 30;                        /* edge of boundary layer guess */
  (*u_tau) = MAX((*u_tau), (u / uplus));
  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    uplus = u / (*u_tau);
    duplus_du_tau = -u / ((*u_tau) * (*u_tau));
    yplus = y * (*u_tau) / nu_mach_re;
    dyplus_du_tau = y / nu_mach_re;
    RSS(ref_phys_spalding_uplus(yplus, &uplus_error), "uplus");
    uplus_error -= uplus;
    RSS(ref_phys_spalding_dyplus_duplus(uplus, &dyplus_duplus),
        "dyplus_duplus");
    uplus_error_du_tau = dyplus_du_tau / dyplus_duplus - duplus_du_tau;
    du_tau = -uplus_error / uplus_error_du_tau;
    if (verbose)
      printf("u_tau %f yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    (*u_tau) += du_tau;

    if (ref_math_divisible(uplus_error, uplus) && ABS(uplus) > 1.0e-3) {
      keep_going = (ABS(uplus_error / uplus) > 1.0e-12);
    } else {
      keep_going = (ABS(uplus_error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded", {
      printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n", y, u, yplus,
             uplus, uplus_error, *u_tau);
    });
  }
  return REF_SUCCESS;
}